

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall vera::Mesh::append(Mesh *this,Mesh *_mesh)

{
  pointer pvVar1;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  uint uVar4;
  undefined8 in_RAX;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  if (_mesh->m_drawMode == this->m_drawMode) {
    pvVar1 = (this->m_vertices).
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar2 = (this->m_vertices).
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_38 = in_RAX;
    std::
    vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<glm::vec<4,float,(glm::qualifier)0>const*,std::vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>>>
              ((vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
                *)&this->m_colors,
               (this->m_colors).
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (_mesh->m_colors).
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_mesh->m_colors).
               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<glm::vec<3,float,(glm::qualifier)0>const*,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&this->m_vertices,
               (this->m_vertices).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (_mesh->m_vertices).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_mesh->m_vertices).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<glm::vec<3,float,(glm::qualifier)0>const*,std::vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>>>
              ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                *)&this->m_normals,
               (this->m_normals).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (_mesh->m_normals).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_mesh->m_normals).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<glm::vec<2,float,(glm::qualifier)0>const*,std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)&this->m_texCoords,
               (this->m_texCoords).
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (_mesh->m_texCoords).
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    puVar5 = (_mesh->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((_mesh->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        uVar4 = puVar5[uVar6] + (int)((ulong)((long)pvVar1 - (long)pvVar2) >> 2) * -0x55555555;
        uStack_38 = CONCAT44(uVar4,(undefined4)uStack_38);
        __position._M_current =
             (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_indices,
                     __position,(uint *)((long)&uStack_38 + 4));
        }
        else {
          *__position._M_current = uVar4;
          (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        puVar5 = (_mesh->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(_mesh->m_indices).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2
                               );
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INCOMPATIBLE DRAW MODES",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void Mesh::addVertices(const std::vector<glm::vec3>& _verts) {
   m_vertices.insert(m_vertices.end(),_verts.begin(),_verts.end());
}